

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerAdapter.cxx
# Opt level: O0

void __thiscall cmDebugger::cmDebuggerAdapter::ReportExitCode(cmDebuggerAdapter *this,int exitCode)

{
  bool bVar1;
  pointer this_00;
  element_type *this_01;
  int64_t i;
  pointer pSVar2;
  pointer this_02;
  undefined1 local_98 [8];
  TerminatedEvent terminatedEvent;
  ExitedEvent exitEvent;
  undefined1 local_40 [8];
  ThreadEvent threadEvent;
  int exitCode_local;
  cmDebuggerAdapter *this_local;
  
  threadEvent.threadId.val._4_4_ = exitCode;
  this_00 = std::
            unique_ptr<cmDebugger::cmDebuggerThreadManager,_std::default_delete<cmDebugger::cmDebuggerThreadManager>_>
            ::operator->(&this->ThreadManager);
  cmDebuggerThreadManager::EndThread(this_00,&this->DefaultThread);
  dap::ThreadEvent::ThreadEvent((ThreadEvent *)local_40);
  std::__cxx11::string::operator=((string *)local_40,"exited");
  this_01 = std::
            __shared_ptr_access<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->DefaultThread);
  i = cmDebuggerThread::GetId(this_01);
  dap::integer::operator=((integer *)((long)&threadEvent.reason.field_2 + 8),i);
  std::__shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->DefaultThread).
              super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>);
  dap::ExitedEvent::ExitedEvent((ExitedEvent *)&terminatedEvent.restart.set);
  dap::integer::operator=
            ((integer *)&terminatedEvent.restart.set,(long)threadEvent.threadId.val._4_4_);
  dap::TerminatedEvent::TerminatedEvent((TerminatedEvent *)local_98);
  bVar1 = std::atomic<bool>::load(&this->SessionActive,memory_order_seq_cst);
  if (bVar1) {
    pSVar2 = std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::operator->
                       (&this->Session);
    dap::Session::send<dap::ThreadEvent,void>(pSVar2,(ThreadEvent *)local_40);
    pSVar2 = std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::operator->
                       (&this->Session);
    dap::Session::send<dap::ExitedEvent,void>(pSVar2,(ExitedEvent *)&terminatedEvent.restart.set);
    pSVar2 = std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::operator->
                       (&this->Session);
    dap::Session::send<dap::TerminatedEvent,void>(pSVar2,(TerminatedEvent *)local_98);
  }
  this_02 = std::unique_ptr<cmDebugger::SyncEvent,_std::default_delete<cmDebugger::SyncEvent>_>::
            operator->(&this->DisconnectEvent);
  SyncEvent::Wait(this_02);
  dap::TerminatedEvent::~TerminatedEvent((TerminatedEvent *)local_98);
  dap::ThreadEvent::~ThreadEvent((ThreadEvent *)local_40);
  return;
}

Assistant:

void cmDebuggerAdapter::ReportExitCode(int exitCode)
{
  ThreadManager->EndThread(DefaultThread);
  dap::ThreadEvent threadEvent;
  threadEvent.reason = "exited";
  threadEvent.threadId = DefaultThread->GetId();
  DefaultThread.reset();

  dap::ExitedEvent exitEvent;
  exitEvent.exitCode = exitCode;

  dap::TerminatedEvent terminatedEvent;

  if (SessionActive.load()) {
    Session->send(threadEvent);
    Session->send(exitEvent);
    Session->send(terminatedEvent);
  }

  // Wait until disconnected or error.
  DisconnectEvent->Wait();
}